

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O1

bool spvtools::opt::anon_unknown_7::ReplaceSwizzleInvocationsMasked
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  uint *puVar1;
  DefUseManager *pDVar2;
  ConstantManager *this;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t operand1;
  array<signed_char,_4UL> aVar7;
  array<signed_char,_4UL> aVar8;
  array<signed_char,_4UL> aVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  Type *pTVar12;
  Constant *pCVar13;
  Instruction *this_00;
  uint uVar14;
  OperandList new_operands;
  InstructionBuilder ir_builder;
  undefined1 local_e8 [24];
  uint local_d0 [2];
  uint *local_c8;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_c0;
  TypeManager *local_b0;
  uint32_t local_a4;
  uint32_t local_a0;
  uint32_t local_9c;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_98;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  InstructionBuilder local_50;
  
  if ((ctx->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(ctx);
  }
  local_b0 = (ctx->type_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((ctx->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(ctx);
  }
  pDVar2 = (ctx->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  if ((ctx->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(ctx);
  }
  this = (ctx->constant_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  IRContext::AddCapability(ctx,CapabilityGroupNonUniformBallot);
  IRContext::AddCapability(ctx,CapabilityGroupNonUniformShuffle);
  local_50.parent_ = IRContext::get_instr_block(ctx,inst);
  local_50.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  uVar14 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar14 = (uint)inst->has_result_id_;
  }
  local_50.context_ = ctx;
  local_50.insert_before_.super_iterator.node_ = (iterator)(iterator)inst;
  uVar3 = Instruction::GetSingleWordOperand(inst,uVar14 + 2);
  uVar14 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar14 = (uint)inst->has_result_id_;
  }
  uVar4 = Instruction::GetSingleWordOperand(inst,uVar14 + 3);
  pIVar10 = analysis::DefUseManager::GetDef(pDVar2,uVar4);
  if (pIVar10->opcode_ != OpConstantComposite) {
    __assert_fail("mask_inst->opcode() == spv::Op::OpConstantComposite && \"The mask is suppose to be a vector constant.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x158,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceSwizzleInvocationsMasked(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar4 = (pIVar10->has_result_id_ & 1) + 1;
  if (pIVar10->has_type_id_ == false) {
    uVar4 = (uint)pIVar10->has_result_id_;
  }
  if ((int)((ulong)((long)(pIVar10->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pIVar10->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar4 != 3
     ) {
    __assert_fail("mask_inst->NumInOperands() == 3 && \"The mask is suppose to have 3 components.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x15a,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceSwizzleInvocationsMasked(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  local_9c = Instruction::GetSingleWordOperand(pIVar10,uVar4);
  uVar14 = (pIVar10->has_result_id_ & 1) + 1;
  if (pIVar10->has_type_id_ == false) {
    uVar14 = (uint)pIVar10->has_result_id_;
  }
  uVar4 = Instruction::GetSingleWordOperand(pIVar10,uVar14 + 1);
  uVar14 = (pIVar10->has_result_id_ & 1) + 1;
  if (pIVar10->has_type_id_ == false) {
    uVar14 = (uint)pIVar10->has_result_id_;
  }
  uVar5 = Instruction::GetSingleWordOperand(pIVar10,uVar14 + 2);
  uVar6 = IRContext::GetBuiltinInputVarId(ctx,0x29);
  local_e8._0_8_ = local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"SPV_KHR_shader_ballot","");
  IRContext::AddExtension(ctx,(string *)local_e8);
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (uVar6 != 0) {
    if ((ctx->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(ctx);
    }
    local_a4 = uVar5;
    local_a0 = uVar3;
    pIVar10 = analysis::DefUseManager::GetDef
                        ((ctx->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,uVar6);
    if ((ctx->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(ctx);
    }
    pDVar2 = (ctx->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar5 = 0;
    uVar3 = 0;
    if (pIVar10->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar10,0);
    }
    pIVar10 = analysis::DefUseManager::GetDef(pDVar2,uVar3);
    uVar14 = (pIVar10->has_result_id_ & 1) + 1;
    if (pIVar10->has_type_id_ == false) {
      uVar14 = (uint)pIVar10->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(pIVar10,uVar14 + 1);
    pIVar10 = InstructionBuilder::AddLoad(&local_50,uVar3,uVar6,0);
    uVar6 = InstructionBuilder::GetUintConstantId(&local_50,0xffffffe0);
    pIVar11 = InstructionBuilder::AddBinaryOp(&local_50,uVar3,OpBitwiseOr,local_9c,uVar6);
    if (pIVar10->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    }
    operand1 = 0;
    uVar6 = 0;
    if (pIVar11->has_result_id_ == true) {
      uVar6 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
    }
    pIVar10 = InstructionBuilder::AddBinaryOp(&local_50,uVar3,OpBitwiseAnd,uVar5,uVar6);
    if (pIVar10->has_result_id_ == true) {
      operand1 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    }
    pIVar10 = InstructionBuilder::AddBinaryOp(&local_50,uVar3,OpBitwiseOr,operand1,uVar4);
    uVar4 = 0;
    if (pIVar10->has_result_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    }
    pIVar10 = InstructionBuilder::AddBinaryOp(&local_50,uVar3,OpBitwiseXor,uVar4,local_a4);
    uVar3 = InstructionBuilder::GetUintConstantId(&local_50,0xffffffff);
    uVar4 = InstructionBuilder::GetUintConstantId(&local_50,3);
    pTVar12 = analysis::TypeManager::GetUIntVectorType(local_b0,4);
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = (_func_int **)0x0;
    local_e8._16_8_ = 0;
    local_e8._0_8_ = operator_new(0x10);
    local_e8._8_8_ = local_e8._0_8_ + 0x10;
    *(uint32_t *)local_e8._0_8_ = uVar3;
    *(uint32_t *)(local_e8._0_8_ + 4) = uVar3;
    *(uint32_t *)(local_e8._0_8_ + 8) = uVar3;
    *(uint32_t *)(local_e8._0_8_ + 0xc) = uVar3;
    local_e8._16_8_ = local_e8._8_8_;
    pCVar13 = analysis::ConstantManager::GetConstant
                        (this,pTVar12,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
    if ((uint32_t *)local_e8._0_8_ != (uint32_t *)0x0) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
    }
    uVar6 = 0;
    pIVar11 = analysis::ConstantManager::GetDefiningInstruction(this,pCVar13,0,(inst_iterator *)0x0)
    ;
    uVar3 = analysis::TypeManager::GetBoolTypeId(local_b0);
    uVar5 = 0;
    if (pIVar11->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
    }
    if (pIVar10->has_result_id_ == true) {
      uVar6 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    }
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = (_func_int **)0x0;
    local_e8._16_8_ = 0;
    local_e8._0_8_ = operator_new(0xc);
    local_e8._8_8_ = local_e8._0_8_ + 0xc;
    *(uint32_t *)local_e8._0_8_ = uVar4;
    *(uint32_t *)(local_e8._0_8_ + 4) = uVar5;
    *(uint32_t *)(local_e8._0_8_ + 8) = uVar6;
    uVar5 = 0;
    local_e8._16_8_ = local_e8._8_8_;
    pIVar11 = InstructionBuilder::AddNaryOp
                        (&local_50,uVar3,OpGroupNonUniformBallotBitExtract,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,0);
    if ((uint32_t *)local_e8._0_8_ != (uint32_t *)0x0) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
    }
    if (inst->has_type_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(inst,0);
    }
    uVar3 = 0;
    if (pIVar10->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    }
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = (_func_int **)0x0;
    local_e8._16_8_ = 0;
    local_e8._0_8_ = operator_new(0xc);
    local_e8._8_8_ = local_e8._0_8_ + 0xc;
    *(uint32_t *)local_e8._0_8_ = uVar4;
    *(uint32_t *)(local_e8._0_8_ + 4) = local_a0;
    *(uint32_t *)(local_e8._0_8_ + 8) = uVar3;
    uVar3 = 0;
    local_e8._16_8_ = local_e8._8_8_;
    pIVar10 = InstructionBuilder::AddNaryOp
                        (&local_50,uVar5,OpGroupNonUniformShuffle,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,0);
    if ((uint32_t *)local_e8._0_8_ != (uint32_t *)0x0) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
    }
    if (inst->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(inst,0);
    }
    pTVar12 = analysis::TypeManager::GetType(local_b0,uVar3);
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = (_func_int **)0x0;
    local_e8._16_8_ = 0;
    pCVar13 = analysis::ConstantManager::GetConstant
                        (this,pTVar12,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
    if ((pointer)local_e8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
    }
    aVar7._M_elems[0] = '\0';
    aVar7._M_elems[1] = '\0';
    aVar7._M_elems[2] = '\0';
    aVar7._M_elems[3] = '\0';
    this_00 = analysis::ConstantManager::GetDefiningInstruction(this,pCVar13,0,(inst_iterator *)0x0)
    ;
    inst->opcode_ = OpSelect;
    local_98.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pIVar11->has_result_id_ == true) {
      aVar7._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_)
      ;
    }
    puVar1 = (uint *)(local_78 + 0x10);
    local_78._0_8_ = &PTR__SmallVector_009488e0;
    local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78._8_8_ = 1;
    local_e8._0_4_ = 1;
    local_e8._8_8_ = &PTR__SmallVector_009488e0;
    local_e8._16_8_ = 0;
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_c8 = local_d0;
    local_78._16_4_ = aVar7._M_elems;
    local_78._24_8_ = puVar1;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_78);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&local_98,(Operand *)local_e8);
    local_e8._8_8_ = &PTR__SmallVector_009488e0;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_c0,local_c0._M_head_impl);
    }
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78._0_8_ = &PTR__SmallVector_009488e0;
    if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_58,local_58._M_head_impl);
    }
    aVar8._M_elems[0] = '\0';
    aVar8._M_elems[1] = '\0';
    aVar8._M_elems[2] = '\0';
    aVar8._M_elems[3] = '\0';
    if (pIVar10->has_result_id_ == true) {
      aVar8._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_)
      ;
    }
    local_78._0_8_ = &PTR__SmallVector_009488e0;
    local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78._8_8_ = 1;
    local_e8._0_4_ = 1;
    local_e8._8_8_ = &PTR__SmallVector_009488e0;
    local_e8._16_8_ = 0;
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_c8 = local_d0;
    local_78._16_4_ = aVar8._M_elems;
    local_78._24_8_ = puVar1;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_78);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&local_98,(Operand *)local_e8);
    local_e8._8_8_ = &PTR__SmallVector_009488e0;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_c0,local_c0._M_head_impl);
    }
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78._0_8_ = &PTR__SmallVector_009488e0;
    if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_58,local_58._M_head_impl);
    }
    aVar9._M_elems[0] = '\0';
    aVar9._M_elems[1] = '\0';
    aVar9._M_elems[2] = '\0';
    aVar9._M_elems[3] = '\0';
    if (this_00->has_result_id_ == true) {
      aVar9._M_elems = (_Type)Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_)
      ;
    }
    local_78._0_8_ = &PTR__SmallVector_009488e0;
    local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78._8_8_ = 1;
    local_e8._0_4_ = 1;
    local_e8._8_8_ = &PTR__SmallVector_009488e0;
    local_e8._16_8_ = 0;
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_c8 = local_d0;
    local_78._16_4_ = aVar9._M_elems;
    local_78._24_8_ = puVar1;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_78);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&local_98,(Operand *)local_e8);
    local_e8._8_8_ = &PTR__SmallVector_009488e0;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_c0,local_c0._M_head_impl);
    }
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78._0_8_ = &PTR__SmallVector_009488e0;
    if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_58,local_58._M_head_impl);
    }
    uVar14 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar14 = (uint)inst->has_result_id_;
    }
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
              (&inst->operands_,
               (Operand *)
               ((long)((((inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                      0xfffffffffffffffa) + (ulong)(uVar14 * 0x30)),
               (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
               &inst->operands_,
               (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               local_98.
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_98.
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    if ((ctx->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::UpdateDefUse
                ((ctx->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,inst);
    }
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_98)
    ;
    return true;
  }
  __assert_fail("var_id != 0 && \"Could not get SubgroupLocalInvocationId variable.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                ,0x164,
                "bool spvtools::opt::(anonymous namespace)::ReplaceSwizzleInvocationsMasked(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
               );
}

Assistant:

bool ReplaceSwizzleInvocationsMasked(
    IRContext* ctx, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = ctx->get_type_mgr();
  analysis::DefUseManager* def_use_mgr = ctx->get_def_use_mgr();
  analysis::ConstantManager* const_mgr = ctx->get_constant_mgr();

  ctx->AddCapability(spv::Capability::GroupNonUniformBallot);
  ctx->AddCapability(spv::Capability::GroupNonUniformShuffle);

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  // Get the operands to inst, and the components of the mask
  uint32_t data_id = inst->GetSingleWordInOperand(2);

  Instruction* mask_inst = def_use_mgr->GetDef(inst->GetSingleWordInOperand(3));
  assert(mask_inst->opcode() == spv::Op::OpConstantComposite &&
         "The mask is suppose to be a vector constant.");
  assert(mask_inst->NumInOperands() == 3 &&
         "The mask is suppose to have 3 components.");

  uint32_t uint_x = mask_inst->GetSingleWordInOperand(0);
  uint32_t uint_y = mask_inst->GetSingleWordInOperand(1);
  uint32_t uint_z = mask_inst->GetSingleWordInOperand(2);

  // Get the subgroup invocation id.
  uint32_t var_id = ctx->GetBuiltinInputVarId(
      uint32_t(spv::BuiltIn::SubgroupLocalInvocationId));
  ctx->AddExtension("SPV_KHR_shader_ballot");
  assert(var_id != 0 && "Could not get SubgroupLocalInvocationId variable.");
  Instruction* var_inst = ctx->get_def_use_mgr()->GetDef(var_id);
  Instruction* var_ptr_type =
      ctx->get_def_use_mgr()->GetDef(var_inst->type_id());
  uint32_t uint_type_id = var_ptr_type->GetSingleWordInOperand(1);

  Instruction* id = ir_builder.AddLoad(uint_type_id, var_id);

  // Do the bitwise operations.
  uint32_t mask_extended = ir_builder.GetUintConstantId(0xFFFFFFE0);
  Instruction* and_mask = ir_builder.AddBinaryOp(
      uint_type_id, spv::Op::OpBitwiseOr, uint_x, mask_extended);
  Instruction* and_result =
      ir_builder.AddBinaryOp(uint_type_id, spv::Op::OpBitwiseAnd,
                             id->result_id(), and_mask->result_id());
  Instruction* or_result = ir_builder.AddBinaryOp(
      uint_type_id, spv::Op::OpBitwiseOr, and_result->result_id(), uint_y);
  Instruction* target_inv = ir_builder.AddBinaryOp(
      uint_type_id, spv::Op::OpBitwiseXor, or_result->result_id(), uint_z);

  // Do the group operations
  uint32_t uint_max_id = ir_builder.GetUintConstantId(0xFFFFFFFF);
  uint32_t subgroup_scope =
      ir_builder.GetUintConstantId(uint32_t(spv::Scope::Subgroup));
  const auto* ballot_value_const = const_mgr->GetConstant(
      type_mgr->GetUIntVectorType(4),
      {uint_max_id, uint_max_id, uint_max_id, uint_max_id});
  Instruction* ballot_value =
      const_mgr->GetDefiningInstruction(ballot_value_const);
  Instruction* is_active = ir_builder.AddNaryOp(
      type_mgr->GetBoolTypeId(), spv::Op::OpGroupNonUniformBallotBitExtract,
      {subgroup_scope, ballot_value->result_id(), target_inv->result_id()});
  Instruction* shuffle =
      ir_builder.AddNaryOp(inst->type_id(), spv::Op::OpGroupNonUniformShuffle,
                           {subgroup_scope, data_id, target_inv->result_id()});

  // Create the null constant to use in the select.
  const auto* null = const_mgr->GetConstant(type_mgr->GetType(inst->type_id()),
                                            std::vector<uint32_t>());
  Instruction* null_inst = const_mgr->GetDefiningInstruction(null);

  // Build the select.
  inst->SetOpcode(spv::Op::OpSelect);
  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {is_active->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {shuffle->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {null_inst->result_id()}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}